

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O1

bool __thiscall IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo(PropertySymOpnd *this)

{
  bool bVar1;
  
  if ((this->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) &&
     (bVar1 = ObjTypeSpecFldInfo::IsPoly(this->objTypeSpecFldInfo), bVar1)) {
    if ((this->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) &&
       (bVar1 = ObjTypeSpecFldInfo::DoesntHaveEquivalence(this->objTypeSpecFldInfo), bVar1)) {
      return true;
    }
    if (this->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
      return true;
    }
    bVar1 = ObjTypeSpecFldInfo::IsLoadedFromProto(this->objTypeSpecFldInfo);
    if (!bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ShouldResetObjTypeSpecFldInfo()
    {
        // If an objTypeSpecFldInfo was created just for the purpose of polymorphic inlining but didn't get used for the same (for some reason or the other), and the polymorphic cache it was created from, wasn't equivalent,
        // we should null out this info on the propertySymOpnd so that assumptions downstream around equivalent object type spec still hold.
        if (HasObjTypeSpecFldInfo() && IsPoly() && (DoesntHaveEquivalence() || !IsLoadedFromProto()))
        {
            return true;
        }
        return false;
    }